

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.cpp
# Opt level: O2

void duckdb::DuckDBAssertInternal(bool condition,char *condition_name,char *file,int linenr)

{
  InternalException *this;
  undefined7 in_register_00000039;
  allocator local_49;
  string local_48;
  
  if ((int)CONCAT71(in_register_00000039,condition) != 0) {
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_48,"Assertion triggered in file \"%s\" on line %d: %s",&local_49);
  InternalException::InternalException<char_const*,int,char_const*>
            (this,&local_48,file,linenr,condition_name);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DuckDBAssertInternal(bool condition, const char *condition_name, const char *file, int linenr) {
#ifdef DISABLE_ASSERTIONS
	return;
#endif
	if (condition) {
		return;
	}
	throw InternalException("Assertion triggered in file \"%s\" on line %d: %s", file, linenr, condition_name);
}